

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphElements.cpp
# Opt level: O1

vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_> * __thiscall
dg::vr::VRLocation::getSuccLocations
          (vector<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>
           *__return_storage_ptr__,VRLocation *this)

{
  pointer *pppVVar1;
  pointer puVar2;
  iterator __position;
  VRLocation **__args;
  unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_> *edge;
  pointer puVar3;
  
  (__return_storage_ptr__->
  super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  puVar2 = (this->successors).
           super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (puVar3 = (this->successors).
                super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; puVar3 != puVar2; puVar3 = puVar3 + 1) {
    __args = &((puVar3->_M_t).
               super___uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>._M_t.
               super__Tuple_impl<0UL,_dg::vr::VREdge_*,_std::default_delete<dg::vr::VREdge>_>.
               super__Head_base<0UL,_dg::vr::VREdge_*,_false>._M_head_impl)->target;
    __position._M_current =
         (__return_storage_ptr__->
         super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>)._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (__return_storage_ptr__->
        super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<dg::vr::VRLocation*,std::allocator<dg::vr::VRLocation*>>::
      _M_realloc_insert<dg::vr::VRLocation*const&>
                ((vector<dg::vr::VRLocation*,std::allocator<dg::vr::VRLocation*>> *)
                 __return_storage_ptr__,__position,__args);
    }
    else {
      *__position._M_current = *__args;
      pppVVar1 = &(__return_storage_ptr__->
                  super__Vector_base<dg::vr::VRLocation_*,_std::allocator<dg::vr::VRLocation_*>_>).
                  _M_impl.super__Vector_impl_data._M_finish;
      *pppVVar1 = *pppVVar1 + 1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<VRLocation *> VRLocation::getSuccLocations() {
    std::vector<VRLocation *> result;
    for (auto &edge : successors) {
        result.push_back(edge->target);
    }
    return result;
}